

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkLock.cpp
# Opt level: O3

void __thiscall chrono::ChLinkLock::Update(ChLinkLock *this,double time,bool update_assets)

{
  (*(this->super_ChLinkMarkers).super_ChLink.super_ChLinkBase.super_ChPhysicsItem.super_ChObj.
    _vptr_ChObj[0x46])();
  (*(this->super_ChLinkMarkers).super_ChLink.super_ChLinkBase.super_ChPhysicsItem.super_ChObj.
    _vptr_ChObj[0x4c])(this);
  (*(this->super_ChLinkMarkers).super_ChLink.super_ChLinkBase.super_ChPhysicsItem.super_ChObj.
    _vptr_ChObj[0x4e])(this);
  Transform_Cq_to_Cqw(&this->Cq1,&this->Cqw1,(this->super_ChLinkMarkers).super_ChLink.Body1);
  Transform_Cq_to_Cqw(&this->Cq2,&this->Cqw2,(this->super_ChLinkMarkers).super_ChLink.Body2);
  (*(this->super_ChLinkMarkers).super_ChLink.super_ChLinkBase.super_ChPhysicsItem.super_ChObj.
    _vptr_ChObj[0x4d])(time,this);
  ChPhysicsItem::Update
            ((ChPhysicsItem *)this,
             (this->super_ChLinkMarkers).super_ChLink.super_ChLinkBase.super_ChPhysicsItem.
             super_ChObj.ChTime,update_assets);
  return;
}

Assistant:

void ChLinkLock::Update(double time, bool update_assets) {
    UpdateTime(time);
    UpdateRelMarkerCoords();
    UpdateState();
    UpdateCqw();
    UpdateForces(time);

    // Update assets
    ChPhysicsItem::Update(ChTime, update_assets);
}